

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

string * __thiscall
chaiscript::eval::Arg_List_AST_Node::pretty_print_abi_cxx11_
          (string *__return_storage_ptr__,Arg_List_AST_Node *this)

{
  pointer psVar1;
  size_t j;
  ulong uVar2;
  long lVar3;
  ostringstream oss;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  lVar3 = 0;
  for (uVar2 = 0;
      psVar1 = (this->super_AST_Node).children.
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->super_AST_Node).children.
                            super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      std::operator<<((ostream *)local_1a8,", ");
      psVar1 = (this->super_AST_Node).children.
               super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    (**(code **)**(undefined8 **)
                  ((long)&(psVar1->
                          super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar3))(local_1c8);
    std::operator<<((ostream *)local_1a8,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    lVar3 = lVar3 + 0x10;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE 
        {
          std::ostringstream oss;
          for (size_t j = 0; j < this->children.size(); ++j) {
            if (j != 0)
            {
              oss << ", ";
            }

            oss << this->children[j]->pretty_print();
          }

          return oss.str();
        }